

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

int32_t ures_countArrayItems_63
                  (UResourceBundle *resourceBundle,char *resourceKey,UErrorCode *status)

{
  int32_t iVar1;
  int32_t iVar2;
  UResourceBundle resData;
  UResourceBundle local_f0;
  
  iVar1 = 0;
  memset(&local_f0,0,200);
  iVar2 = 0;
  if ((status != (UErrorCode *)0x0) && (iVar2 = iVar1, *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resourceBundle == (UResourceBundle *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      ures_getByKey_63(resourceBundle,resourceKey,&local_f0,status);
      if (local_f0.fResData.data == (UDataMemory *)0x0) {
        *status = U_MISSING_RESOURCE_ERROR;
      }
      else {
        iVar1 = res_countArrayItems_63(&local_f0.fResData,local_f0.fRes);
      }
      ures_closeBundle(&local_f0,'\x01');
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
ures_countArrayItems(const UResourceBundle* resourceBundle,
                  const char* resourceKey,
                  UErrorCode* status)
{
    UResourceBundle resData;
    ures_initStackObject(&resData);
    if (status==NULL || U_FAILURE(*status)) {
        return 0;
    }
    if(resourceBundle == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    ures_getByKey(resourceBundle, resourceKey, &resData, status);
    
    if(resData.fResData.data != NULL) {
        int32_t result = res_countArrayItems(&resData.fResData, resData.fRes);
        ures_close(&resData);
        return result;
    } else {
        *status = U_MISSING_RESOURCE_ERROR;
        ures_close(&resData);
        return 0;
    }
}